

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

int Disto4x4_SSE2(uint8_t *a,uint8_t *b,uint16_t *w)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  unkuint9 Var42;
  undefined1 auVar43 [11];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  undefined1 auVar47 [15];
  unkuint9 Var48;
  undefined1 auVar49 [11];
  undefined1 auVar50 [15];
  unkuint9 Var51;
  undefined1 auVar52 [11];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  uint uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ushort uVar64;
  short sVar65;
  short sVar68;
  uint uVar66;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar67 [16];
  short sVar74;
  ushort uVar75;
  short sVar76;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar77 [16];
  short sVar84;
  ushort uVar85;
  short sVar86;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  undefined1 auVar87 [16];
  short sVar94;
  ushort uVar95;
  short sVar96;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  undefined1 auVar97 [16];
  short sVar106;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar107;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  
  uVar1 = *(undefined8 *)a;
  uVar2 = *(undefined8 *)(a + 0x20);
  uVar3 = *(undefined8 *)(a + 0x40);
  uVar4 = *(undefined8 *)(a + 0x60);
  lVar5 = *(long *)b;
  auVar67._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar67._0_8_ = uVar1;
  auVar67._12_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar63._4_8_ = auVar67._8_8_;
  auVar63._0_4_ = (int)lVar5;
  auVar63._12_4_ = 0;
  auVar63 = auVar63 << 0x20;
  lVar6 = *(long *)(b + 0x20);
  auVar77._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar77._0_8_ = uVar2;
  auVar77._12_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar99._4_8_ = auVar77._8_8_;
  auVar99._0_4_ = (int)lVar6;
  auVar99._12_4_ = 0;
  auVar99 = auVar99 << 0x20;
  lVar7 = *(long *)(b + 0x40);
  auVar87._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar87._0_8_ = uVar3;
  auVar87._12_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar109._4_8_ = auVar87._8_8_;
  auVar109._0_4_ = (int)lVar7;
  auVar109._12_4_ = 0;
  auVar109 = auVar109 << 0x20;
  lVar8 = *(long *)(b + 0x60);
  auVar97._8_4_ = (int)((ulong)uVar4 >> 0x20);
  auVar97._0_8_ = uVar4;
  auVar97._12_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar126._4_8_ = auVar97._8_8_;
  auVar126._0_4_ = (int)lVar8;
  auVar126._12_4_ = 0;
  auVar126 = auVar126 << 0x20;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar63._0_13_;
  auVar9[0xe] = (char)((ulong)lVar5 >> 0x18);
  auVar13[0xc] = (char)((ulong)lVar5 >> 0x10);
  auVar13._0_12_ = auVar63._0_12_;
  auVar13._13_2_ = auVar9._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar63._0_11_;
  auVar17._12_3_ = auVar13._12_3_;
  auVar21[10] = (char)((ulong)lVar5 >> 8);
  auVar21._0_10_ = auVar63._0_10_;
  auVar21._11_4_ = auVar17._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar63._0_9_;
  auVar25._10_5_ = auVar21._10_5_;
  auVar29[8] = (char)lVar5;
  auVar29._0_8_ = lVar5 << 0x20;
  auVar29._9_6_ = auVar25._9_6_;
  auVar41._7_8_ = 0;
  auVar41._0_7_ = auVar29._8_7_;
  Var42 = CONCAT81(SUB158(auVar41 << 0x40,7),(char)((ulong)uVar1 >> 0x18));
  auVar53._9_6_ = 0;
  auVar53._0_9_ = Var42;
  auVar43._1_10_ = SUB1510(auVar53 << 0x30,5);
  auVar43[0] = (char)((ulong)uVar1 >> 0x10);
  auVar54._11_4_ = 0;
  auVar54._0_11_ = auVar43;
  auVar37[2] = (char)((ulong)uVar1 >> 8);
  auVar37._0_2_ = (ushort)uVar1;
  auVar37._3_12_ = SUB1512(auVar54 << 0x20,3);
  uVar64 = (ushort)uVar1 & 0xff;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar99._0_13_;
  auVar10[0xe] = (char)((ulong)lVar6 >> 0x18);
  auVar14[0xc] = (char)((ulong)lVar6 >> 0x10);
  auVar14._0_12_ = auVar99._0_12_;
  auVar14._13_2_ = auVar10._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar99._0_11_;
  auVar18._12_3_ = auVar14._12_3_;
  auVar22[10] = (char)((ulong)lVar6 >> 8);
  auVar22._0_10_ = auVar99._0_10_;
  auVar22._11_4_ = auVar18._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar99._0_9_;
  auVar26._10_5_ = auVar22._10_5_;
  auVar30[8] = (char)lVar6;
  auVar30._0_8_ = lVar6 << 0x20;
  auVar30._9_6_ = auVar26._9_6_;
  auVar44._7_8_ = 0;
  auVar44._0_7_ = auVar30._8_7_;
  Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),(char)((ulong)uVar2 >> 0x18));
  auVar55._9_6_ = 0;
  auVar55._0_9_ = Var45;
  auVar46._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar46[0] = (char)((ulong)uVar2 >> 0x10);
  auVar56._11_4_ = 0;
  auVar56._0_11_ = auVar46;
  auVar38[2] = (char)((ulong)uVar2 >> 8);
  auVar38._0_2_ = (ushort)uVar2;
  auVar38._3_12_ = SUB1512(auVar56 << 0x20,3);
  uVar75 = (ushort)uVar2 & 0xff;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar109._0_13_;
  auVar11[0xe] = (char)((ulong)lVar7 >> 0x18);
  auVar15[0xc] = (char)((ulong)lVar7 >> 0x10);
  auVar15._0_12_ = auVar109._0_12_;
  auVar15._13_2_ = auVar11._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar109._0_11_;
  auVar19._12_3_ = auVar15._12_3_;
  auVar23[10] = (char)((ulong)lVar7 >> 8);
  auVar23._0_10_ = auVar109._0_10_;
  auVar23._11_4_ = auVar19._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar109._0_9_;
  auVar27._10_5_ = auVar23._10_5_;
  auVar31[8] = (char)lVar7;
  auVar31._0_8_ = lVar7 << 0x20;
  auVar31._9_6_ = auVar27._9_6_;
  auVar47._7_8_ = 0;
  auVar47._0_7_ = auVar31._8_7_;
  Var48 = CONCAT81(SUB158(auVar47 << 0x40,7),(char)((ulong)uVar3 >> 0x18));
  auVar57._9_6_ = 0;
  auVar57._0_9_ = Var48;
  auVar49._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar49[0] = (char)((ulong)uVar3 >> 0x10);
  auVar58._11_4_ = 0;
  auVar58._0_11_ = auVar49;
  auVar39[2] = (char)((ulong)uVar3 >> 8);
  auVar39._0_2_ = (ushort)uVar3;
  auVar39._3_12_ = SUB1512(auVar58 << 0x20,3);
  uVar85 = (ushort)uVar3 & 0xff;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar126._0_13_;
  auVar12[0xe] = (char)((ulong)lVar8 >> 0x18);
  auVar16[0xc] = (char)((ulong)lVar8 >> 0x10);
  auVar16._0_12_ = auVar126._0_12_;
  auVar16._13_2_ = auVar12._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar126._0_11_;
  auVar20._12_3_ = auVar16._12_3_;
  auVar24[10] = (char)((ulong)lVar8 >> 8);
  auVar24._0_10_ = auVar126._0_10_;
  auVar24._11_4_ = auVar20._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar126._0_9_;
  auVar28._10_5_ = auVar24._10_5_;
  auVar32[8] = (char)lVar8;
  auVar32._0_8_ = lVar8 << 0x20;
  auVar32._9_6_ = auVar28._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar32._8_7_;
  Var51 = CONCAT81(SUB158(auVar50 << 0x40,7),(char)((ulong)uVar4 >> 0x18));
  auVar59._9_6_ = 0;
  auVar59._0_9_ = Var51;
  auVar52._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar52[0] = (char)((ulong)uVar4 >> 0x10);
  auVar60._11_4_ = 0;
  auVar60._0_11_ = auVar52;
  auVar40[2] = (char)((ulong)uVar4 >> 8);
  auVar40._0_2_ = (ushort)uVar4;
  auVar40._3_12_ = SUB1512(auVar60 << 0x20,3);
  uVar95 = (ushort)uVar4 & 0xff;
  sVar107 = uVar85 + uVar64;
  sVar110 = auVar39._2_2_ + auVar37._2_2_;
  sVar111 = auVar49._0_2_ + auVar43._0_2_;
  sVar70 = (short)Var42;
  sVar72 = (short)Var48;
  sVar112 = sVar72 + sVar70;
  sVar113 = auVar31._8_2_ + auVar29._8_2_;
  sVar114 = auVar23._10_2_ + auVar21._10_2_;
  uVar34 = auVar11._13_2_ >> 8;
  sVar115 = auVar15._12_2_ + auVar13._12_2_;
  uVar33 = auVar9._13_2_ >> 8;
  sVar116 = uVar34 + uVar33;
  sVar117 = uVar95 + uVar75;
  sVar118 = auVar40._2_2_ + auVar38._2_2_;
  sVar119 = auVar52._0_2_ + auVar46._0_2_;
  sVar80 = (short)Var45;
  sVar68 = (short)Var51;
  sVar120 = sVar68 + sVar80;
  sVar121 = auVar32._8_2_ + auVar30._8_2_;
  sVar122 = auVar24._10_2_ + auVar22._10_2_;
  uVar36 = auVar12._13_2_ >> 8;
  sVar123 = auVar16._12_2_ + auVar14._12_2_;
  uVar35 = auVar10._13_2_ >> 8;
  sVar124 = uVar36 + uVar35;
  sVar76 = uVar75 - uVar95;
  sVar78 = auVar38._2_2_ - auVar40._2_2_;
  sVar79 = auVar46._0_2_ - auVar52._0_2_;
  sVar80 = sVar80 - sVar68;
  sVar81 = auVar30._8_2_ - auVar32._8_2_;
  sVar82 = auVar22._10_2_ - auVar24._10_2_;
  sVar83 = auVar14._12_2_ - auVar16._12_2_;
  sVar84 = uVar35 - uVar36;
  sVar65 = uVar64 - uVar85;
  sVar68 = auVar37._2_2_ - auVar39._2_2_;
  sVar69 = auVar43._0_2_ - auVar49._0_2_;
  sVar70 = sVar70 - sVar72;
  sVar71 = auVar29._8_2_ - auVar31._8_2_;
  sVar72 = auVar21._10_2_ - auVar23._10_2_;
  sVar73 = auVar13._12_2_ - auVar15._12_2_;
  sVar74 = uVar33 - uVar34;
  sVar96 = sVar117 + sVar107;
  sVar100 = sVar118 + sVar110;
  sVar101 = sVar119 + sVar111;
  sVar102 = sVar120 + sVar112;
  sVar103 = sVar121 + sVar113;
  sVar104 = sVar122 + sVar114;
  sVar105 = sVar123 + sVar115;
  sVar106 = sVar124 + sVar116;
  sVar86 = sVar76 + sVar65;
  sVar88 = sVar78 + sVar68;
  sVar89 = sVar79 + sVar69;
  sVar90 = sVar80 + sVar70;
  sVar91 = sVar81 + sVar71;
  sVar92 = sVar82 + sVar72;
  sVar93 = sVar83 + sVar73;
  sVar94 = sVar84 + sVar74;
  sVar65 = sVar65 - sVar76;
  sVar68 = sVar68 - sVar78;
  sVar69 = sVar69 - sVar79;
  sVar70 = sVar70 - sVar80;
  sVar71 = sVar71 - sVar81;
  sVar72 = sVar72 - sVar82;
  sVar73 = sVar73 - sVar83;
  sVar74 = sVar74 - sVar84;
  sVar107 = sVar107 - sVar117;
  sVar110 = sVar110 - sVar118;
  sVar111 = sVar111 - sVar119;
  sVar112 = sVar112 - sVar120;
  sVar113 = sVar113 - sVar121;
  sVar114 = sVar114 - sVar122;
  sVar115 = sVar115 - sVar123;
  sVar116 = sVar116 - sVar124;
  sVar79 = sVar96 + sVar101;
  sVar80 = sVar86 + sVar89;
  sVar81 = sVar65 + sVar69;
  sVar82 = sVar107 + sVar111;
  sVar83 = sVar103 + sVar105;
  sVar84 = sVar91 + sVar93;
  sVar117 = sVar71 + sVar73;
  sVar118 = sVar113 + sVar115;
  sVar76 = sVar100 + sVar102;
  sVar78 = sVar88 + sVar90;
  sVar123 = sVar68 + sVar70;
  sVar124 = sVar110 + sVar112;
  sVar127 = sVar104 + sVar106;
  sVar128 = sVar92 + sVar94;
  sVar129 = sVar72 + sVar74;
  sVar130 = sVar114 + sVar116;
  sVar100 = sVar100 - sVar102;
  sVar88 = sVar88 - sVar90;
  sVar68 = sVar68 - sVar70;
  sVar110 = sVar110 - sVar112;
  sVar104 = sVar104 - sVar106;
  sVar92 = sVar92 - sVar94;
  sVar72 = sVar72 - sVar74;
  sVar114 = sVar114 - sVar116;
  sVar96 = sVar96 - sVar101;
  sVar86 = sVar86 - sVar89;
  sVar65 = sVar65 - sVar69;
  sVar107 = sVar107 - sVar111;
  sVar103 = sVar103 - sVar105;
  sVar91 = sVar91 - sVar93;
  sVar71 = sVar71 - sVar73;
  sVar113 = sVar113 - sVar115;
  sVar89 = sVar79 + sVar76;
  sVar90 = sVar80 + sVar78;
  sVar93 = sVar81 + sVar123;
  sVar94 = sVar82 + sVar124;
  sVar101 = sVar83 + sVar127;
  sVar102 = sVar84 + sVar128;
  sVar105 = sVar117 + sVar129;
  sVar106 = sVar118 + sVar130;
  sVar111 = sVar96 + sVar100;
  sVar112 = sVar86 + sVar88;
  sVar115 = sVar65 + sVar68;
  sVar116 = sVar107 + sVar110;
  sVar119 = sVar103 + sVar104;
  sVar120 = sVar91 + sVar92;
  sVar121 = sVar71 + sVar72;
  sVar122 = sVar113 + sVar114;
  sVar96 = sVar96 - sVar100;
  sVar86 = sVar86 - sVar88;
  sVar65 = sVar65 - sVar68;
  sVar107 = sVar107 - sVar110;
  sVar103 = sVar103 - sVar104;
  sVar91 = sVar91 - sVar92;
  sVar71 = sVar71 - sVar72;
  sVar113 = sVar113 - sVar114;
  sVar79 = sVar79 - sVar76;
  sVar80 = sVar80 - sVar78;
  sVar81 = sVar81 - sVar123;
  sVar82 = sVar82 - sVar124;
  sVar83 = sVar83 - sVar127;
  sVar84 = sVar84 - sVar128;
  sVar117 = sVar117 - sVar129;
  sVar118 = sVar118 - sVar130;
  sVar68 = -sVar89;
  sVar69 = -sVar90;
  sVar70 = -sVar93;
  sVar72 = -sVar94;
  sVar73 = -sVar111;
  sVar74 = -sVar112;
  sVar76 = -sVar115;
  sVar78 = -sVar116;
  auVar98._0_2_ = (ushort)(sVar68 < sVar89) * sVar89 | (ushort)(sVar68 >= sVar89) * sVar68;
  auVar98._2_2_ = (ushort)(sVar69 < sVar90) * sVar90 | (ushort)(sVar69 >= sVar90) * sVar69;
  auVar98._4_2_ = (ushort)(sVar70 < sVar93) * sVar93 | (ushort)(sVar70 >= sVar93) * sVar70;
  auVar98._6_2_ = (ushort)(sVar72 < sVar94) * sVar94 | (ushort)(sVar72 >= sVar94) * sVar72;
  auVar98._8_2_ = (ushort)(sVar73 < sVar111) * sVar111 | (ushort)(sVar73 >= sVar111) * sVar73;
  auVar98._10_2_ = (ushort)(sVar74 < sVar112) * sVar112 | (ushort)(sVar74 >= sVar112) * sVar74;
  auVar98._12_2_ = (ushort)(sVar76 < sVar115) * sVar115 | (ushort)(sVar76 >= sVar115) * sVar76;
  auVar98._14_2_ = (ushort)(sVar78 < sVar116) * sVar116 | (ushort)(sVar78 >= sVar116) * sVar78;
  sVar68 = -sVar96;
  sVar69 = -sVar86;
  sVar70 = -sVar65;
  sVar72 = -sVar107;
  sVar73 = -sVar79;
  sVar74 = -sVar80;
  sVar76 = -sVar81;
  sVar78 = -sVar82;
  auVar108._0_2_ = (ushort)(sVar68 < sVar96) * sVar96 | (ushort)(sVar68 >= sVar96) * sVar68;
  auVar108._2_2_ = (ushort)(sVar69 < sVar86) * sVar86 | (ushort)(sVar69 >= sVar86) * sVar69;
  auVar108._4_2_ = (ushort)(sVar70 < sVar65) * sVar65 | (ushort)(sVar70 >= sVar65) * sVar70;
  auVar108._6_2_ = (ushort)(sVar72 < sVar107) * sVar107 | (ushort)(sVar72 >= sVar107) * sVar72;
  auVar108._8_2_ = (ushort)(sVar73 < sVar79) * sVar79 | (ushort)(sVar73 >= sVar79) * sVar73;
  auVar108._10_2_ = (ushort)(sVar74 < sVar80) * sVar80 | (ushort)(sVar74 >= sVar80) * sVar74;
  auVar108._12_2_ = (ushort)(sVar76 < sVar81) * sVar81 | (ushort)(sVar76 >= sVar81) * sVar76;
  auVar108._14_2_ = (ushort)(sVar78 < sVar82) * sVar82 | (ushort)(sVar78 >= sVar82) * sVar78;
  sVar68 = -sVar101;
  sVar69 = -sVar102;
  sVar70 = -sVar105;
  sVar72 = -sVar106;
  sVar73 = -sVar119;
  sVar74 = -sVar120;
  sVar76 = -sVar121;
  sVar78 = -sVar122;
  auVar125._0_2_ = (ushort)(sVar68 < sVar101) * sVar101 | (ushort)(sVar68 >= sVar101) * sVar68;
  auVar125._2_2_ = (ushort)(sVar69 < sVar102) * sVar102 | (ushort)(sVar69 >= sVar102) * sVar69;
  auVar125._4_2_ = (ushort)(sVar70 < sVar105) * sVar105 | (ushort)(sVar70 >= sVar105) * sVar70;
  auVar125._6_2_ = (ushort)(sVar72 < sVar106) * sVar106 | (ushort)(sVar72 >= sVar106) * sVar72;
  auVar125._8_2_ = (ushort)(sVar73 < sVar119) * sVar119 | (ushort)(sVar73 >= sVar119) * sVar73;
  auVar125._10_2_ = (ushort)(sVar74 < sVar120) * sVar120 | (ushort)(sVar74 >= sVar120) * sVar74;
  auVar125._12_2_ = (ushort)(sVar76 < sVar121) * sVar121 | (ushort)(sVar76 >= sVar121) * sVar76;
  auVar125._14_2_ = (ushort)(sVar78 < sVar122) * sVar122 | (ushort)(sVar78 >= sVar122) * sVar78;
  sVar68 = -sVar103;
  sVar69 = -sVar91;
  sVar70 = -sVar71;
  sVar72 = -sVar113;
  sVar73 = -sVar83;
  sVar74 = -sVar84;
  sVar76 = -sVar117;
  sVar78 = -sVar118;
  auVar62._0_2_ = (ushort)(sVar68 < sVar103) * sVar103 | (ushort)(sVar68 >= sVar103) * sVar68;
  auVar62._2_2_ = (ushort)(sVar69 < sVar91) * sVar91 | (ushort)(sVar69 >= sVar91) * sVar69;
  auVar62._4_2_ = (ushort)(sVar70 < sVar71) * sVar71 | (ushort)(sVar70 >= sVar71) * sVar70;
  auVar62._6_2_ = (ushort)(sVar72 < sVar113) * sVar113 | (ushort)(sVar72 >= sVar113) * sVar72;
  auVar62._8_2_ = (ushort)(sVar73 < sVar83) * sVar83 | (ushort)(sVar73 >= sVar83) * sVar73;
  auVar62._10_2_ = (ushort)(sVar74 < sVar84) * sVar84 | (ushort)(sVar74 >= sVar84) * sVar74;
  auVar62._12_2_ = (ushort)(sVar76 < sVar117) * sVar117 | (ushort)(sVar76 >= sVar117) * sVar76;
  auVar62._14_2_ = (ushort)(sVar78 < sVar118) * sVar118 | (ushort)(sVar78 >= sVar118) * sVar78;
  auVar99 = pmaddwd(auVar98,*(undefined1 (*) [16])w);
  auVar109 = pmaddwd(auVar108,*(undefined1 (*) [16])(w + 8));
  auVar126 = pmaddwd(auVar125,*(undefined1 (*) [16])w);
  auVar63 = pmaddwd(auVar62,*(undefined1 (*) [16])(w + 8));
  uVar66 = ((auVar109._12_4_ + auVar99._12_4_) - (auVar63._12_4_ + auVar126._12_4_)) +
           ((auVar109._4_4_ + auVar99._4_4_) - (auVar63._4_4_ + auVar126._4_4_)) +
           ((auVar109._8_4_ + auVar99._8_4_) - (auVar63._8_4_ + auVar126._8_4_)) +
           ((auVar109._0_4_ + auVar99._0_4_) - (auVar63._0_4_ + auVar126._0_4_));
  uVar61 = -uVar66;
  if (0 < (int)uVar66) {
    uVar61 = uVar66;
  }
  return uVar61 >> 5;
}

Assistant:

static int TTransform_SSE2(const uint8_t* WEBP_RESTRICT inA,
                           const uint8_t* WEBP_RESTRICT inB,
                           const uint16_t* WEBP_RESTRICT const w) {
  int32_t sum[4];
  __m128i tmp_0, tmp_1, tmp_2, tmp_3;
  const __m128i zero = _mm_setzero_si128();

  // Load and combine inputs.
  {
    const __m128i inA_0 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 0]);
    const __m128i inA_1 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 1]);
    const __m128i inA_2 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 2]);
    const __m128i inA_3 = _mm_loadl_epi64((const __m128i*)&inA[BPS * 3]);
    const __m128i inB_0 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 0]);
    const __m128i inB_1 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 1]);
    const __m128i inB_2 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 2]);
    const __m128i inB_3 = _mm_loadl_epi64((const __m128i*)&inB[BPS * 3]);

    // Combine inA and inB (we'll do two transforms in parallel).
    const __m128i inAB_0 = _mm_unpacklo_epi32(inA_0, inB_0);
    const __m128i inAB_1 = _mm_unpacklo_epi32(inA_1, inB_1);
    const __m128i inAB_2 = _mm_unpacklo_epi32(inA_2, inB_2);
    const __m128i inAB_3 = _mm_unpacklo_epi32(inA_3, inB_3);
    tmp_0 = _mm_unpacklo_epi8(inAB_0, zero);
    tmp_1 = _mm_unpacklo_epi8(inAB_1, zero);
    tmp_2 = _mm_unpacklo_epi8(inAB_2, zero);
    tmp_3 = _mm_unpacklo_epi8(inAB_3, zero);
    // a00 a01 a02 a03   b00 b01 b02 b03
    // a10 a11 a12 a13   b10 b11 b12 b13
    // a20 a21 a22 a23   b20 b21 b22 b23
    // a30 a31 a32 a33   b30 b31 b32 b33
  }

  // Vertical pass first to avoid a transpose (vertical and horizontal passes
  // are commutative because w/kWeightY is symmetric) and subsequent transpose.
  {
    // Calculate a and b (two 4x4 at once).
    const __m128i a0 = _mm_add_epi16(tmp_0, tmp_2);
    const __m128i a1 = _mm_add_epi16(tmp_1, tmp_3);
    const __m128i a2 = _mm_sub_epi16(tmp_1, tmp_3);
    const __m128i a3 = _mm_sub_epi16(tmp_0, tmp_2);
    const __m128i b0 = _mm_add_epi16(a0, a1);
    const __m128i b1 = _mm_add_epi16(a3, a2);
    const __m128i b2 = _mm_sub_epi16(a3, a2);
    const __m128i b3 = _mm_sub_epi16(a0, a1);
    // a00 a01 a02 a03   b00 b01 b02 b03
    // a10 a11 a12 a13   b10 b11 b12 b13
    // a20 a21 a22 a23   b20 b21 b22 b23
    // a30 a31 a32 a33   b30 b31 b32 b33

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&b0, &b1, &b2, &b3, &tmp_0, &tmp_1, &tmp_2, &tmp_3);
  }

  // Horizontal pass and difference of weighted sums.
  {
    // Load all inputs.
    const __m128i w_0 = _mm_loadu_si128((const __m128i*)&w[0]);
    const __m128i w_8 = _mm_loadu_si128((const __m128i*)&w[8]);

    // Calculate a and b (two 4x4 at once).
    const __m128i a0 = _mm_add_epi16(tmp_0, tmp_2);
    const __m128i a1 = _mm_add_epi16(tmp_1, tmp_3);
    const __m128i a2 = _mm_sub_epi16(tmp_1, tmp_3);
    const __m128i a3 = _mm_sub_epi16(tmp_0, tmp_2);
    const __m128i b0 = _mm_add_epi16(a0, a1);
    const __m128i b1 = _mm_add_epi16(a3, a2);
    const __m128i b2 = _mm_sub_epi16(a3, a2);
    const __m128i b3 = _mm_sub_epi16(a0, a1);

    // Separate the transforms of inA and inB.
    __m128i A_b0 = _mm_unpacklo_epi64(b0, b1);
    __m128i A_b2 = _mm_unpacklo_epi64(b2, b3);
    __m128i B_b0 = _mm_unpackhi_epi64(b0, b1);
    __m128i B_b2 = _mm_unpackhi_epi64(b2, b3);

    {
      const __m128i d0 = _mm_sub_epi16(zero, A_b0);
      const __m128i d1 = _mm_sub_epi16(zero, A_b2);
      const __m128i d2 = _mm_sub_epi16(zero, B_b0);
      const __m128i d3 = _mm_sub_epi16(zero, B_b2);
      A_b0 = _mm_max_epi16(A_b0, d0);   // abs(v), 16b
      A_b2 = _mm_max_epi16(A_b2, d1);
      B_b0 = _mm_max_epi16(B_b0, d2);
      B_b2 = _mm_max_epi16(B_b2, d3);
    }

    // weighted sums
    A_b0 = _mm_madd_epi16(A_b0, w_0);
    A_b2 = _mm_madd_epi16(A_b2, w_8);
    B_b0 = _mm_madd_epi16(B_b0, w_0);
    B_b2 = _mm_madd_epi16(B_b2, w_8);
    A_b0 = _mm_add_epi32(A_b0, A_b2);
    B_b0 = _mm_add_epi32(B_b0, B_b2);

    // difference of weighted sums
    A_b0 = _mm_sub_epi32(A_b0, B_b0);
    _mm_storeu_si128((__m128i*)&sum[0], A_b0);
  }
  return sum[0] + sum[1] + sum[2] + sum[3];
}